

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateReset(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  inflate_state *state;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    *(undefined4 *)((long)&piVar1->gzhead + 4) = 0;
    *(undefined4 *)&piVar1->gzindex = 0;
    *(undefined4 *)((long)&piVar1->gzindex + 4) = 0;
    strm_local._4_4_ = inflateResetKeep(strm);
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateReset(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    state->wsize = 0;
    state->whave = 0;
    state->wnext = 0;
    return inflateResetKeep(strm);
}